

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

KeyInfo * sqlite3KeyInfoAlloc(sqlite3 *db,int N,int X)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  sqlite3 *in_RDI;
  KeyInfo *p;
  int nExtra;
  undefined4 in_stack_ffffffffffffffe0;
  KeyInfo *local_8;
  
  iVar1 = (in_ESI + in_EDX) * 9 + -8;
  local_8 = (KeyInfo *)
            sqlite3DbMallocRawNN
                      ((sqlite3 *)CONCAT44(in_ESI,in_EDX),CONCAT44(iVar1,in_stack_ffffffffffffffe0))
  ;
  if (local_8 == (KeyInfo *)0x0) {
    local_8 = (KeyInfo *)sqlite3OomFault((sqlite3 *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
  }
  else {
    local_8->aSortFlags = (u8 *)(local_8->aColl + (in_ESI + in_EDX));
    local_8->nKeyField = (u16)in_ESI;
    local_8->nAllField = (u16)in_ESI + (short)in_EDX;
    local_8->enc = in_RDI->enc;
    local_8->db = in_RDI;
    local_8->nRef = 1;
    memset(local_8 + 1,0,(long)iVar1);
  }
  return local_8;
}

Assistant:

SQLITE_PRIVATE KeyInfo *sqlite3KeyInfoAlloc(sqlite3 *db, int N, int X){
  int nExtra = (N+X)*(sizeof(CollSeq*)+1) - sizeof(CollSeq*);
  KeyInfo *p = sqlite3DbMallocRawNN(db, sizeof(KeyInfo) + nExtra);
  if( p ){
    p->aSortFlags = (u8*)&p->aColl[N+X];
    p->nKeyField = (u16)N;
    p->nAllField = (u16)(N+X);
    p->enc = ENC(db);
    p->db = db;
    p->nRef = 1;
    memset(&p[1], 0, nExtra);
  }else{
    return (KeyInfo*)sqlite3OomFault(db);
  }
  return p;
}